

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QByteArray * __thiscall QMetaObjectBuilder::classInfoValue(QMetaObjectBuilder *this,int index)

{
  qsizetype qVar1;
  QByteArray *a;
  int in_EDX;
  long in_RSI;
  QList<QByteArray> *in_RDI;
  QList<QByteArray> *this_00;
  
  if (-1 < in_EDX) {
    a = (QByteArray *)(long)in_EDX;
    this_00 = in_RDI;
    qVar1 = QList<QByteArray>::size((QList<QByteArray> *)(*(long *)(in_RSI + 8) + 0x88));
    if ((long)a < qVar1) {
      QList<QByteArray>::operator[](this_00,(qsizetype)a);
      QByteArray::QByteArray((QByteArray *)this_00,a);
      return (QByteArray *)in_RDI;
    }
  }
  QByteArray::QByteArray((QByteArray *)0x373f21);
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray QMetaObjectBuilder::classInfoValue(int index) const
{
    if (index >= 0 && index < d->classInfoValues.size())
        return d->classInfoValues[index];
    else
        return QByteArray();
}